

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_cbc.cc
# Opt level: O3

int EVP_sha1_final_with_secret_suffix
              (SHA_CTX *ctx,uint8_t *out,uint8_t *in,size_t len,size_t max_len)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  undefined2 uVar4;
  uint uVar5;
  int iVar6;
  size_t j;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong __n;
  size_t i;
  ulong uVar13;
  undefined5 uVar14;
  undefined1 auVar15 [16];
  uint32_t result [5];
  uint8_t block [64];
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  iVar6 = 0;
  if (((max_len >> 0x3d == 0) && (iVar6 = 0, ctx->Nh == 0)) &&
     (uVar5 = ctx->Nl, iVar6 = 0,
     max_len * 8 + (ulong)uVar5 >> 0x20 == 0 && !CARRY8(max_len * 8,(ulong)uVar5))) {
    uVar1 = ctx->num;
    uVar11 = len + uVar1 + 0x48 >> 6;
    uVar5 = uVar5 + (int)len * 8;
    local_88 = ZEXT416(uVar5 * 0x1000000 |
                       (uVar5 & 0xff00) << 8 | (uVar5 >> 0x10 & 0xff) << 8 | uVar5 >> 0x18);
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_a8 = (undefined1  [16])0x0;
    local_98 = 0;
    uVar10 = 0;
    uVar13 = 0;
    do {
      if ((uVar13 == 0) && (__n = (ulong)ctx->num, __n != 0)) {
        memcpy(local_78,ctx->data,__n);
      }
      else {
        __n = 0;
      }
      uVar7 = max_len - uVar10;
      if (uVar10 <= max_len && uVar7 != 0) {
        uVar12 = 0x40 - __n;
        if (uVar7 <= 0x40 - __n) {
          uVar12 = uVar7;
        }
        if (uVar12 != 0) {
          memcpy(local_78 + __n,in + uVar10,uVar12);
        }
      }
      if ((uint)__n < 0x40) {
        uVar7 = uVar10;
        uVar12 = __n;
        do {
          bVar3 = (byte)(uVar7 >> 0x38);
          bVar2 = (byte)((len ^ uVar7) >> 0x38);
          local_78[uVar12] =
               (byte)((len ^ uVar7) - 1 >> 0x38) & ~bVar2 & 0x80 |
               (char)(((byte)(uVar7 - len >> 0x38) ^ bVar3 | bVar2) ^ bVar3) >> 7 & local_78[uVar12]
          ;
          uVar12 = uVar12 + 1;
          uVar7 = uVar7 + 1;
        } while (uVar12 != 0x40);
      }
      uVar5 = (uint)((uVar13 ^ uVar11 - 1) - 1 >> 0x20) & (uint)(-uVar11 >> 0x20);
      uVar9 = (int)uVar5 >> 0x1f;
      auVar15[3] = (char)((int)uVar5 >> 0x1f);
      uVar4 = CONCAT11(auVar15[3],auVar15[3]);
      uVar14 = CONCAT14(auVar15[3],uVar9);
      auVar15._4_4_ = (int)(CONCAT35(CONCAT21(uVar4,auVar15[3]),uVar14) >> 0x20);
      auVar15[2] = auVar15[3];
      auVar15[1] = auVar15[3];
      auVar15[0] = auVar15[3];
      auVar15._8_8_ = 0;
      auVar15 = pshuflw(auVar15,auVar15,0);
      local_48._12_4_ = local_48._12_4_ | auVar15._0_4_ & local_88._0_4_;
      SHA1_Transform((SHA_CTX *)ctx,local_78);
      lVar8 = 0;
      do {
        *(uint *)(local_a8 + lVar8 * 4) = *(uint *)(local_a8 + lVar8 * 4) | ctx->h[lVar8] & uVar9;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 5);
      uVar10 = (uVar10 + 0x40) - __n;
      uVar13 = uVar13 + 1;
    } while (uVar13 != max_len + uVar1 + 0x48 >> 6);
    lVar8 = 0;
    do {
      uVar5 = *(uint *)(local_a8 + lVar8 * 4);
      *(uint *)(out + lVar8 * 4) =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 5);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int EVP_sha1_final_with_secret_suffix(SHA_CTX *ctx,
                                      uint8_t out[SHA_DIGEST_LENGTH],
                                      const uint8_t *in, size_t len,
                                      size_t max_len) {
  // Bound the input length so |total_bits| below fits in four bytes. This is
  // redundant with TLS record size limits. This also ensures |input_idx| below
  // does not overflow.
  size_t max_len_bits = max_len << 3;
  if (ctx->Nh != 0 ||
      (max_len_bits >> 3) != max_len ||  // Overflow
      ctx->Nl + max_len_bits < max_len_bits ||
      ctx->Nl + max_len_bits > UINT32_MAX) {
    return 0;
  }

  // We need to hash the following into |ctx|:
  //
  // - ctx->data[:ctx->num]
  // - in[:len]
  // - A 0x80 byte
  // - However many zero bytes are needed to pad up to a block.
  // - Eight bytes of length.
  size_t num_blocks = (ctx->num + len + 1 + 8 + SHA_CBLOCK - 1) >> 6;
  size_t last_block = num_blocks - 1;
  size_t max_blocks = (ctx->num + max_len + 1 + 8 + SHA_CBLOCK - 1) >> 6;

  // The bounds above imply |total_bits| fits in four bytes.
  size_t total_bits = ctx->Nl + (len << 3);
  uint8_t length_bytes[4];
  length_bytes[0] = (uint8_t)(total_bits >> 24);
  length_bytes[1] = (uint8_t)(total_bits >> 16);
  length_bytes[2] = (uint8_t)(total_bits >> 8);
  length_bytes[3] = (uint8_t)total_bits;

  // We now construct and process each expected block in constant-time.
  uint8_t block[SHA_CBLOCK] = {0};
  uint32_t result[5] = {0};
  // input_idx is the index into |in| corresponding to the current block.
  // However, we allow this index to overflow beyond |max_len|, to simplify the
  // 0x80 byte.
  size_t input_idx = 0;
  for (size_t i = 0; i < max_blocks; i++) {
    // Fill |block| with data from the partial block in |ctx| and |in|. We copy
    // as if we were hashing up to |max_len| and then zero the excess later.
    size_t block_start = 0;
    if (i == 0) {
      OPENSSL_memcpy(block, ctx->data, ctx->num);
      block_start = ctx->num;
    }
    if (input_idx < max_len) {
      size_t to_copy = SHA_CBLOCK - block_start;
      if (to_copy > max_len - input_idx) {
        to_copy = max_len - input_idx;
      }
      OPENSSL_memcpy(block + block_start, in + input_idx, to_copy);
    }

    // Zero any bytes beyond |len| and add the 0x80 byte.
    for (size_t j = block_start; j < SHA_CBLOCK; j++) {
      // input[idx] corresponds to block[j].
      size_t idx = input_idx + j - block_start;
      // The barriers on |len| are not strictly necessary. However, without
      // them, GCC compiles this code by incorporating |len| into the loop
      // counter and subtracting it out later. This is still constant-time, but
      // it frustrates attempts to validate this.
      uint8_t is_in_bounds = constant_time_lt_8(idx, value_barrier_w(len));
      uint8_t is_padding_byte = constant_time_eq_8(idx, value_barrier_w(len));
      block[j] &= is_in_bounds;
      block[j] |= 0x80 & is_padding_byte;
    }

    input_idx += SHA_CBLOCK - block_start;

    // Fill in the length if this is the last block.
    crypto_word_t is_last_block = constant_time_eq_w(i, last_block);
    for (size_t j = 0; j < 4; j++) {
      block[SHA_CBLOCK - 4 + j] |= is_last_block & length_bytes[j];
    }

    // Process the block and save the hash state if it is the final value.
    SHA1_Transform(ctx, block);
    for (size_t j = 0; j < 5; j++) {
      result[j] |= is_last_block & ctx->h[j];
    }
  }

  // Write the output.
  for (size_t i = 0; i < 5; i++) {
    CRYPTO_store_u32_be(out + 4 * i, result[i]);
  }
  return 1;
}